

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_atomic.c
# Opt level: O2

void test_atomic(void)

{
  uint __line;
  char cVar1;
  undefined8 uVar2;
  char *__assertion;
  int iVar3;
  bool bVar4;
  undefined1 local_e0 [8];
  thread_pool_t tp;
  
  tp_init(local_e0,10);
  tp_start(local_e0);
  iVar3 = 0x14;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    uVar2 = tp_task_create(f,cleanup,0,0);
    tp_post_task(local_e0,uVar2);
  }
  cVar1 = tp_join_tasks(local_e0);
  if (cVar1 == '\0') {
    __assertion = "tp_join_tasks(&tp)";
    __line = 0x34;
  }
  else if (tp.has_task.__data.__g_signals[0] == 0) {
    iVar3 = queue_len(&tp.threads);
    if (iVar3 == 0) {
      fprintf(_stderr,"The atomic counter is %u\n",(ulong)(uint)acnt);
      fprintf(_stderr,"The non-atomic counter is %u\n",(ulong)(uint)cnt);
      tp_destroy(local_e0);
      return;
    }
    __assertion = "queue_isempty(&tp.task_queue)";
    __line = 0x37;
  }
  else {
    __assertion = "tp.active_tasks == 0";
    __line = 0x36;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_atomic.c"
                ,__line,"void test_atomic()");
}

Assistant:

void test_atomic()
{
    int i;
    thread_pool_t tp;
    tp_task_t *tasks[TASK_NUM];

    tp_init(&tp, THREAD_NUM);
    tp_start(&tp);

    for (i = 0; i < TASK_NUM; ++i) {
        tasks[i] = tp_task_create(f, cleanup, NULL, 0);
        tp_post_task(&tp, tasks[i]);
    }

//    assert(TASK_NUM == tp_post_tasks(&tp, tasks, TASK_NUM));
    assert(tp_join_tasks(&tp));

    assert(tp.active_tasks == 0);
    assert(queue_isempty(&tp.task_queue));

    fprintf(stderr, "The atomic counter is %u\n", acnt);
    fprintf(stderr, "The non-atomic counter is %u\n", cnt);

    tp_destroy(&tp);
}